

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O2

double __thiscall embree::BVHN<8>::preBuild(BVHN<8> *this,string *builderName)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  double dVar5;
  Lock<embree::MutexSys> lock;
  
  bVar1 = std::operator==(builderName,"");
  if (bVar1) {
    dVar5 = INFINITY;
  }
  else {
    bVar1 = State::verbosity(&this->device->super_State,2);
    if (bVar1) {
      lock.mutex = (MutexSys *)&g_printMutex;
      lock.locked = true;
      MutexSys::lock((MutexSys *)&g_printMutex);
      poVar2 = std::operator<<((ostream *)&std::cout,"building BVH");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,8);
      lVar3 = std::__cxx11::string::find((char *)builderName,0x1f51059);
      pcVar4 = "MB";
      if (lVar3 == -1) {
        pcVar4 = "";
      }
      poVar2 = std::operator<<(poVar2,pcVar4);
      poVar2 = std::operator<<(poVar2,"<");
      pcVar4 = (char *)(**(code **)**(undefined8 **)&(this->super_AccelData).field_0x58)();
      poVar2 = std::operator<<(poVar2,pcVar4);
      poVar2 = std::operator<<(poVar2,"> using ");
      poVar2 = std::operator<<(poVar2,(string *)builderName);
      poVar2 = std::operator<<(poVar2," ...");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::ostream::flush();
      Lock<embree::MutexSys>::~Lock(&lock);
    }
    if (((this->device->super_State).benchmark == 0) &&
       (bVar1 = State::verbosity(&this->device->super_State,2), !bVar1)) {
      return 0.0;
    }
    dVar5 = getSeconds();
  }
  return dVar5;
}

Assistant:

double BVHN<N>::preBuild(const std::string& builderName)
  {
    if (builderName == "") 
      return inf;

    if (device->verbosity(2))
    {
      Lock<MutexSys> lock(g_printMutex);
      std::cout << "building BVH" << N << (builderName.find("MBlur") != std::string::npos ? "MB" : "") << "<" << primTy->name() << "> using " << builderName << " ..." << std::endl << std::flush;
    }

    double t0 = 0.0;
    if (device->benchmark || device->verbosity(2)) t0 = getSeconds();
    return t0;
  }